

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

GLuint glcts::bitfieldReverse(GLuint input)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = 0;
  iVar2 = 0x20;
  do {
    uVar1 = input & 0x80000000 | uVar1 >> 1;
    input = input * 2;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return uVar1;
}

Assistant:

static GLuint bitfieldReverse(GLuint input)
{
	GLuint result = 0;
	for (int i = 0; i < 32; ++i)
	{
		result >>= 1;
		result |= (input & 0x80000000);
		input <<= 1;
	}
	return result;
}